

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O0

SentencePieceNormalizer * __thiscall
sentencepiece::SentencePieceNormalizer::LoadFromRuleTSV
          (SentencePieceNormalizer *this,string_view filename)

{
  bool bVar1;
  pointer this_00;
  NormalizerSpec *this_01;
  __uniq_ptr_data<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>,_true,_true>
  _Var2;
  unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_> local_78;
  uint local_70;
  byte local_6a;
  allocator<char> local_69;
  string local_68;
  NormalizerSpec *local_38;
  NormalizerSpec *spec;
  __single_object model_proto;
  SentencePieceNormalizer *this_local;
  string_view filename_local;
  Status *_status;
  
  this_local = (SentencePieceNormalizer *)filename._M_str;
  _Var2.
  super___uniq_ptr_impl<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>.
  _M_t.
  super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
  .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl =
       (__uniq_ptr_impl<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>)
       filename._M_len;
  model_proto._M_t.
  super___uniq_ptr_impl<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>.
  _M_t.
  super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
  .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl =
       (__uniq_ptr_data<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>,_true,_true>
        )(__uniq_ptr_data<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>,_true,_true>
          )_Var2.
           super___uniq_ptr_impl<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
           ._M_t.
           super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
           .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl;
  filename_local._M_str = (char *)this;
  std::make_unique<sentencepiece::ModelProto>();
  this_00 = std::
            unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
            operator->((unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
                        *)&spec);
  this_01 = ModelProto::mutable_normalizer_spec(this_00);
  local_38 = this_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_68,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_69);
  NormalizerSpec::set_normalization_rule_tsv(this_01,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  local_6a = 0;
  SentencePieceTrainer::PopulateNormalizerSpec((SentencePieceTrainer *)this,local_38,false);
  bVar1 = util::Status::ok((Status *)this);
  if (!bVar1) {
    local_6a = 1;
  }
  local_70 = (uint)!bVar1;
  if ((local_6a & 1) == 0) {
    sentencepiece::util::Status::~Status((Status *)this);
  }
  if (local_70 == 0) {
    std::unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
    unique_ptr(&local_78,
               (unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
                *)&spec);
    (**(code **)(*(long *)_Var2.
                          super___uniq_ptr_impl<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
                          .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl +
                0x10))(this,_Var2.
                            super___uniq_ptr_impl<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
                            .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl,
                       &local_78);
    std::unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
    ~unique_ptr(&local_78);
    local_70 = 1;
  }
  std::unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
  ~unique_ptr((unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
               *)&spec);
  return this;
}

Assistant:

util::Status SentencePieceNormalizer::LoadFromRuleTSV(
    absl::string_view filename) {
  auto model_proto = std::make_unique<ModelProto>();
  auto *spec = model_proto->mutable_normalizer_spec();
  spec->set_normalization_rule_tsv(std::string(filename));
  RETURN_IF_ERROR(SentencePieceTrainer::PopulateNormalizerSpec(spec));
  return Load(std::move(model_proto));
}